

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O2

int kftp_get_response(knetFile *ftp)

{
  ushort *puVar1;
  uint uVar2;
  int iVar3;
  ssize_t sVar4;
  char *pcVar5;
  ushort **ppuVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uchar c;
  char *p;
  
  iVar3 = socket_wait(ftp->ctrl_fd,1);
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  else {
    uVar2 = 0;
    do {
      do {
        uVar8 = uVar2;
        sVar4 = read(ftp->ctrl_fd,&c,1);
        if (sVar4 == 0) {
          if ((int)uVar8 < 2) {
            return -1;
          }
          pcVar5 = ftp->response;
          uVar10 = uVar8;
          goto LAB_001102d8;
        }
        iVar3 = ftp->max_response;
        pcVar5 = ftp->response;
        if (iVar3 <= (int)uVar8) {
          iVar9 = iVar3 * 2;
          if (iVar3 == 0) {
            iVar9 = 0x100;
          }
          ftp->max_response = iVar9;
          pcVar5 = (char *)realloc(pcVar5,(long)iVar9);
          ftp->response = pcVar5;
        }
        uVar10 = uVar8 + 1;
        pcVar5[(int)uVar8] = c;
        uVar2 = uVar10;
      } while ((c != '\n') || (uVar2 = 0, (int)uVar8 < 3));
      ppuVar6 = __ctype_b_loc();
      puVar1 = *ppuVar6;
      pcVar5 = ftp->response;
      uVar2 = 0;
    } while (((*(byte *)((long)puVar1 + (long)*pcVar5 * 2 + 1) & 8) == 0) ||
            (((uVar2 = 0, (*(byte *)((long)puVar1 + (long)pcVar5[1] * 2 + 1) & 8) == 0 ||
              (uVar2 = 0, (*(byte *)((long)puVar1 + (long)pcVar5[2] * 2 + 1) & 8) == 0)) ||
             (pcVar5[3] == '-'))));
LAB_001102d8:
    pcVar5[(ulong)uVar10 - 2] = '\0';
    lVar7 = strtol(ftp->response,&p,0);
    iVar3 = (int)lVar7;
  }
  return iVar3;
}

Assistant:

static int kftp_get_response(knetFile *ftp)
{
#ifndef _WIN32
	unsigned char c;
#else
	char c;
#endif
	int n = 0;
	char *p;
	if (socket_wait(ftp->ctrl_fd, 1) <= 0) return 0;
	while (netread(ftp->ctrl_fd, &c, 1)) { // FIXME: this is *VERY BAD* for unbuffered I/O
		//fputc(c, stderr);
		if (n >= ftp->max_response) {
			ftp->max_response = ftp->max_response? ftp->max_response<<1 : 256;
			ftp->response = (char*)realloc(ftp->response, ftp->max_response);
		}
		ftp->response[n++] = c;
		if (c == '\n') {
			if (n >= 4 && isdigit(ftp->response[0]) && isdigit(ftp->response[1]) && isdigit(ftp->response[2])
				&& ftp->response[3] != '-') break;
			n = 0;
			continue;
		}
	}
	if (n < 2) return -1;
	ftp->response[n-2] = 0;
	return strtol(ftp->response, &p, 0);
}